

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumOptions>
          (Tables *this,EnumOptions *param_1)

{
  EnumOptions *this_00;
  EnumOptions *local_18;
  
  this_00 = (EnumOptions *)operator_new(0x70);
  EnumOptions::EnumOptions(this_00);
  local_18 = this_00;
  std::vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>>::
  emplace_back<google::protobuf::Message*>
            ((vector<google::protobuf::Message*,std::allocator<google::protobuf::Message*>> *)
             &this->messages_,(Message **)&local_18);
  return this_00;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}